

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O3

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::acquire
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *mutex,int recursive,bool write)

{
  shared_mutex *__rwlock;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined8 uVar4;
  anon_union_8_1_a8a14541_for_iterator_1 aVar5;
  iterator iVar6;
  void *local_60;
  void *local_58;
  _Head_base<0UL,_void_*&,_false> local_50;
  tuple<> local_48 [8];
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>::iterator,_bool>
  local_40;
  
  if (recursive < 2) {
    __rwlock = &this->g_lock;
    local_60 = mutex;
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar3 == 0x23) {
      uVar4 = std::__throw_system_error(0x23);
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      _Unwind_Resume(uVar4);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = mutex;
    iVar6 = phmap::container_internal::
            raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
            ::find<void*>((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                           *)&this->locks,&local_60,
                          SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                          SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0));
    aVar5 = iVar6.field_1;
    if (iVar6.ctrl_ ==
        (this->locks).
        super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
        .
        super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
        .ctrl_ + (this->locks).
                 super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                 .
                 super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                 .capacity_) {
      local_50._M_head_impl = &local_58;
      local_58 = local_60;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_60;
      phmap::container_internal::
      raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
      ::
      emplace_decomposable<void*,std::piecewise_construct_t_const&,std::tuple<void*&>,std::tuple<>>
                (&local_40,
                 (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                  *)&this->locks,local_50._M_head_impl,
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
                 (piecewise_construct_t *)&std::piecewise_construct,(tuple<void_*&> *)&local_50,
                 local_48);
      aVar5 = local_40.first.field_1;
    }
    VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
              ((VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)tls,
               (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)
               ((long)aVar5.slot_ + 8));
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  }
  return;
}

Assistant:

void acquire(tls_t tls, void* mutex, int recursive, bool write) final {
    if (recursive >
        1) {   // lock haven't been updated by another thread (by definition)
      return;  // therefore no action needed here as only the invoking thread
               // may have updated the lock
    }

    std::lock_guard<LockT> exLockT(g_lock);
    auto it = locks.find(mutex);
    if (it == locks.end()) {
      it = createLock(mutex);
    }
    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
    (thr)->update(it->second);
  }